

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathCompleteGraphsBenchmark.cpp
# Opt level: O0

double __thiscall
PathCompleteGraphsBenchmark::getDeletionsTime
          (PathCompleteGraphsBenchmark *this,unsigned_long deletions)

{
  type_conflict tVar1;
  bool bVar2;
  iterator __first;
  iterator __last;
  reference peVar3;
  reference pvVar4;
  DynamicGraph *this_00;
  reference peVar5;
  clock_t cVar6;
  long lVar7;
  double elapsed_secs;
  clock_t end;
  unsigned_long local_d8;
  __normal_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_*,_std::vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>_>
  local_d0;
  __normal_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_*,_std::vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>_>
  local_c8;
  iterator e;
  clock_t begin;
  _Self local_b0;
  iterator i;
  int counter;
  reference local_90;
  tuples local_78 [16];
  pair<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>_>
  local_68;
  undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
  local_58;
  EdgeIterator ei_end;
  undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
  local_40;
  EdgeIterator ei;
  vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  edges;
  int deletionsCount;
  unsigned_long deletions_local;
  PathCompleteGraphsBenchmark *this_local;
  
  edges.
  super__Vector_base<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::
  vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  ::vector((vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
            *)&ei);
  boost::detail::
  undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
  ::undirected_edge_iter(&local_40);
  boost::detail::
  undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
  ::undirected_edge_iter(&local_58);
  local_68 = boost::
             edges<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>
                       ((undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config>
                         *)&(this->super_Benchmark).G);
  boost::tuples::
  tie<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,long>,boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,long>>
            (local_78,&local_40,&local_58);
  boost::tuples::
  tuple<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,long>&,boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,long>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,long>&,boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,boost::no_property>>,boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,long>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)local_78,&local_68);
  while( true ) {
    tVar1 = boost::iterators::operator!=
                      ((iterator_facade<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
                        *)&local_40,
                       (iterator_facade<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
                        *)&local_58);
    if (!tVar1) break;
    boost::iterators::detail::
    iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
    ::operator*(&local_90,
                (iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
                 *)&local_40);
    std::
    vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
    ::push_back((vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
                 *)&ei,&local_90);
    edges.
    super__Vector_base<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         edges.
         super__Vector_base<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
    if ((long)edges.
              super__Vector_base<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == deletions) break;
    boost::iterators::detail::
    iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
    ::operator++((iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
                  *)&local_40);
  }
  __first = std::
            vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
            ::begin((vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
                     *)&ei);
  __last = std::
           vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
           ::end((vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
                  *)&ei);
  std::
  random_shuffle<__gnu_cxx::__normal_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>*,std::vector<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>>>>
            ((__normal_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_*,_std::vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>_>
              )__first._M_current,
             (__normal_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_*,_std::vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>_>
              )__last._M_current);
  i._M_node._4_4_ = 0;
  local_b0._M_node =
       (_Base_ptr)
       std::
       set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
       ::begin(&this->deletionSet);
  while( true ) {
    begin = (clock_t)std::
                     set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
                     ::end(&this->deletionSet);
    bVar2 = std::operator!=(&local_b0,(_Self *)&begin);
    if ((!bVar2) || (deletions <= (ulong)(long)i._M_node._4_4_)) break;
    peVar3 = std::
             _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>
             ::operator*(&local_b0);
    pvVar4 = std::
             vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
             ::operator[]((vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
                           *)&ei,(long)i._M_node._4_4_);
    (pvVar4->super_edge_base<boost::undirected_tag,_unsigned_long>).m_source =
         (peVar3->super_edge_base<boost::undirected_tag,_unsigned_long>).m_source;
    (pvVar4->super_edge_base<boost::undirected_tag,_unsigned_long>).m_target =
         (peVar3->super_edge_base<boost::undirected_tag,_unsigned_long>).m_target;
    pvVar4->m_eproperty = peVar3->m_eproperty;
    std::
    _Rb_tree_const_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>::
    operator++(&local_b0);
  }
  e._M_current = (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)clock();
  local_c8._M_current =
       (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)
       std::
       vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
       ::begin((vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
                *)&ei);
  while( true ) {
    local_d0._M_current =
         (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)
         std::
         vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
         ::end((vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
                *)&ei);
    bVar2 = __gnu_cxx::operator!=(&local_c8,&local_d0);
    if (!bVar2) break;
    this_00 = &(this->super_Benchmark).G;
    peVar5 = __gnu_cxx::
             __normal_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_*,_std::vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>_>
             ::operator*(&local_c8);
    local_d8 = boost::
               source<boost::undirected_tag,unsigned_long,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>
                         (&peVar5->super_edge_base<boost::undirected_tag,_unsigned_long>,
                          &this_00->super_UndirectedGraph);
    peVar5 = __gnu_cxx::
             __normal_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_*,_std::vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>_>
             ::operator*(&local_c8);
    end = boost::
          target<boost::undirected_tag,unsigned_long,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>
                    (&peVar5->super_edge_base<boost::undirected_tag,_unsigned_long>,
                     &(this->super_Benchmark).G.super_UndirectedGraph);
    DynamicGraph::deleteEdge(this_00,&local_d8,(Vertex *)&end);
    __gnu_cxx::
    __normal_iterator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_*,_std::vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>_>
    ::operator++(&local_c8);
  }
  cVar6 = clock();
  lVar7 = cVar6 - (long)e._M_current;
  std::
  vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  ::~vector((vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
             *)&ei);
  return (double)lVar7 / 1000000.0;
}

Assistant:

double PathCompleteGraphsBenchmark::getDeletionsTime(unsigned long deletions)
{
    int deletionsCount = 0;
    std::vector<Edge> edges;

    EdgeIterator ei, ei_end;
    for(boost::tie(ei, ei_end) = boost::edges(G); ei != ei_end; ++ei) {
        edges.push_back(*ei);
        deletionsCount++;
        if (deletionsCount==deletions) {
            break;
        }
    }

    std::random_shuffle(edges.begin(), edges.end());

    // put the edges connecting the complete subgraphs at the beginning
    int counter = 0;
    for (auto i=this->deletionSet.begin(); i!=this->deletionSet.end(); ++i) {
        if (counter>=deletions) break;
        edges[counter] = *i;
    }

    clock_t begin = clock();
    for(auto e = edges.begin(); e!=edges.end(); ++e) {
        G.deleteEdge(boost::source(*e, G), boost::target(*e, G));
    }
    clock_t end = clock();
    double elapsed_secs = double(end-begin) / CLOCKS_PER_SEC;
    return elapsed_secs;
}